

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_serial_impl_deserialize.c
# Opt level: O2

int metacall_serial_impl_deserialize_char(value *v,char *src,size_t length)

{
  ulong uVar1;
  value pvVar2;
  uint uVar3;
  
  uVar3 = 1;
  if ((*src == '0') && (src[1] == 'x')) {
    uVar1 = strtol(src,(char **)0x0,0x10);
    if (uVar1 < 0x100) {
      pvVar2 = (value)value_create_char((int)(char)uVar1);
      *v = pvVar2;
      uVar3 = (uint)(pvVar2 == (value)0x0);
    }
  }
  return uVar3;
}

Assistant:

int metacall_serial_impl_deserialize_char(value *v, const char *src, size_t length)
{
	long l = 0;

	(void)length;

	if (src[0] != '0' || src[1] != 'x')
	{
		return 1;
	}

	l = strtol(src, NULL, 16);

	if (l < 0 || l > 255)
	{
		return 1;
	}

	*v = value_create_char((char)(l & 0xFF));

	return (*v == NULL);
}